

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O1

bool __thiscall TcpSocketImpl::GetConnectionInfo(TcpSocketImpl *this)

{
  char *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__nptr;
  long *plVar2;
  int iVar3;
  int *piVar4;
  size_t sVar5;
  undefined8 uVar6;
  long lVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  bool bVar9;
  string caAddrPeer;
  socklen_t addLen;
  string caAddrClient;
  string servInfoPeer;
  string servInfoClient;
  sockaddr_storage addrPe;
  sockaddr_storage addrCl;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  socklen_t local_1b4;
  long *local_1b0 [2];
  long local_1a0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  long *local_170 [2];
  long local_160 [2];
  string local_150;
  sockaddr local_130 [8];
  sockaddr local_b0 [8];
  
  local_1b4 = 0x80;
  iVar3 = getpeername((this->super_BaseSocketImpl).m_fSock,local_b0,&local_1b4);
  if (iVar3 == 0) {
    local_1b4 = 0x80;
    iVar3 = getsockname((this->super_BaseSocketImpl).m_fSock,local_130,&local_1b4);
    if (iVar3 == 0) {
      local_1b0[0] = local_1a0;
      std::__cxx11::string::_M_construct((ulong)local_1b0,'/');
      local_170[0] = local_160;
      std::__cxx11::string::_M_construct((ulong)local_170,' ');
      iVar3 = getnameinfo(local_b0,0x80,(char *)local_1b0[0],0x2e,(char *)local_170[0],0x20,3);
      plVar2 = local_1b0[0];
      if (iVar3 != 0) {
        piVar4 = __errno_location();
        (this->super_BaseSocketImpl).m_iError = *piVar4;
        (this->super_BaseSocketImpl).m_iErrLoc = 0xc;
        bVar9 = false;
LAB_001190db:
        if (local_170[0] != local_160) {
          operator_delete(local_170[0],local_160[0] + 1);
        }
        if (local_1b0[0] == local_1a0) {
          return bVar9;
        }
        operator_delete(local_1b0[0],local_1a0[0] + 1);
        return bVar9;
      }
      pcVar1 = (char *)(this->m_strClientAddr)._M_string_length;
      strlen((char *)local_1b0[0]);
      std::__cxx11::string::_M_replace((ulong)&this->m_strClientAddr,0,pcVar1,(ulong)plVar2);
      plVar2 = local_170[0];
      local_1d8[0] = &local_1c8;
      if (local_170[0] == (long *)0x0) {
        lVar7 = 1;
      }
      else {
        sVar5 = strlen((char *)local_170[0]);
        lVar7 = (long)plVar2 + sVar5;
      }
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,plVar2,lVar7);
      __nptr = local_1d8[0];
      piVar4 = __errno_location();
      iVar3 = *piVar4;
      *piVar4 = 0;
      paVar8 = &local_190;
      lVar7 = strtol(__nptr->_M_local_buf,(char **)&paVar8->_M_allocated_capacity,10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_allocated_capacity == __nptr) {
        std::__throw_invalid_argument("stoi");
      }
      else {
        paVar8 = &local_1c8;
        if (((int)lVar7 == lVar7) && (*piVar4 != 0x22)) {
          if (*piVar4 == 0) {
            *piVar4 = iVar3;
          }
          this->m_sClientPort = (uint16_t)lVar7;
          if (local_1d8[0] != paVar8) {
            operator_delete(local_1d8[0],local_1c8._M_allocated_capacity + 1);
          }
          local_1d8[0] = paVar8;
          std::__cxx11::string::_M_construct((ulong)local_1d8,'/');
          local_190._M_allocated_capacity = (size_type)&local_180;
          std::__cxx11::string::_M_construct((ulong)&local_190,' ');
          iVar3 = getnameinfo(local_130,0x80,local_1d8[0]->_M_local_buf,0x2e,
                              (char *)local_190._M_allocated_capacity,0x20,3);
          bVar9 = iVar3 == 0;
          if (bVar9) {
            std::__cxx11::string::operator=
                      ((string *)&this->m_strIFaceAddr,local_1d8[0]->_M_local_buf);
            uVar6 = local_190._M_allocated_capacity;
            paVar8 = &local_150.field_2;
            local_150._M_dataplus._M_p = (pointer)paVar8;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_190._M_allocated_capacity ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              lVar7 = 1;
            }
            else {
              sVar5 = strlen((char *)local_190._M_allocated_capacity);
              lVar7 = sVar5 + uVar6;
            }
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,uVar6,lVar7);
            iVar3 = std::__cxx11::stoi(&local_150,(size_t *)0x0,10);
            this->m_sIFacePort = (uint16_t)iVar3;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p != paVar8) {
              operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1
                             );
            }
          }
          else {
            (this->super_BaseSocketImpl).m_iError = *piVar4;
            (this->super_BaseSocketImpl).m_iErrLoc = 0xd;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_allocated_capacity != &local_180) {
            operator_delete((void *)local_190._M_allocated_capacity,
                            local_180._M_allocated_capacity + 1);
          }
          if (local_1d8[0] != &local_1c8) {
            operator_delete(local_1d8[0],local_1c8._M_allocated_capacity + 1);
          }
          goto LAB_001190db;
        }
      }
      uVar6 = std::__throw_out_of_range("stoi");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != paVar8) {
        operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_allocated_capacity != __nptr) {
        operator_delete((void *)local_190._M_allocated_capacity,local_180._M_allocated_capacity + 1)
        ;
      }
      if (local_1d8[0] != &local_1c8) {
        operator_delete(local_1d8[0],local_1c8._M_allocated_capacity + 1);
      }
      if (local_170[0] != local_160) {
        operator_delete(local_170[0],local_160[0] + 1);
      }
      if (local_1b0[0] != local_1a0) {
        operator_delete(local_1b0[0],local_1a0[0] + 1);
      }
      _Unwind_Resume(uVar6);
    }
    piVar4 = __errno_location();
    (this->super_BaseSocketImpl).m_iError = *piVar4;
    (this->super_BaseSocketImpl).m_iErrLoc = 0xb;
  }
  else {
    piVar4 = __errno_location();
    (this->super_BaseSocketImpl).m_iError = *piVar4;
    (this->super_BaseSocketImpl).m_iErrLoc = 10;
  }
  return false;
}

Assistant:

bool TcpSocketImpl::GetConnectionInfo()
{
    struct sockaddr_storage addrCl;
    socklen_t addLen = sizeof(addrCl);
    if (::getpeername(m_fSock, reinterpret_cast<struct sockaddr*>(&addrCl), &addLen) != 0)  // Get the IP to where the connection was established
    {
        m_iError = WSAGetLastError();
        m_iErrLoc = 10;
        return false;
    }

    struct sockaddr_storage addrPe;
    addLen = sizeof(addrPe);
    if (::getsockname(m_fSock, reinterpret_cast<struct sockaddr*>(&addrPe), &addLen) != 0)  // Get our IP where the connection was established
    {
        m_iError = WSAGetLastError();
        m_iErrLoc = 11;
        return false;
    }

    string caAddrClient(INET6_ADDRSTRLEN + 1, 0);
    string servInfoClient(NI_MAXSERV, 0);
    if (::getnameinfo(reinterpret_cast<struct sockaddr*>(&addrCl), sizeof(struct sockaddr_storage), &caAddrClient[0], INET6_ADDRSTRLEN, &servInfoClient[0], NI_MAXSERV, NI_NUMERICHOST | NI_NUMERICSERV) == 0)
    {
        m_strClientAddr = &caAddrClient[0];
        m_sClientPort = static_cast<uint16_t>(stoi(&servInfoClient[0]));
    }
    else
    {
        m_iError = WSAGetLastError();
        m_iErrLoc = 12;
        return false;
    }

    string caAddrPeer(INET6_ADDRSTRLEN + 1, 0);
    string servInfoPeer(NI_MAXSERV, 0);
    if (::getnameinfo(reinterpret_cast<struct sockaddr*>(&addrPe), sizeof(struct sockaddr_storage), &caAddrPeer[0], INET6_ADDRSTRLEN, &servInfoPeer[0], NI_MAXSERV, NI_NUMERICHOST | NI_NUMERICSERV) == 0)
    {
        m_strIFaceAddr = &caAddrPeer[0];
        m_sIFacePort = static_cast<uint16_t>(stoi(&servInfoPeer[0]));
    }
    else
    {
        m_iError = WSAGetLastError();
        m_iErrLoc = 13;
        return false;
    }

    return true;
}